

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void cm_zlib__tr_stored_block(deflate_state *s,charf *buf,ulg stored_len,int eof)

{
  Bytef BVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ushort uVar6;
  
  iVar5 = s->bi_valid;
  uVar6 = (ushort)(eof << ((byte)iVar5 & 0x1f)) | s->bi_buf;
  s->bi_buf = uVar6;
  if (iVar5 < 0xe) {
    iVar5 = iVar5 + 3;
  }
  else {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)uVar6;
    BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = BVar1;
    s->bi_buf = (ush)((eof & 0xffffU) >> (0x10U - (char)s->bi_valid & 0x1f));
    iVar5 = s->bi_valid + -0xd;
  }
  s->bi_valid = iVar5;
  bi_windup(s);
  s->last_eob_len = 8;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)stored_len;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)(stored_len >> 8);
  uVar3 = (uint)stored_len ^ 0xffff;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)uVar3;
  uVar3 = uVar3 >> 8;
  lVar4 = 0;
  while( true ) {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)uVar3;
    if ((uint)stored_len == (uint)lVar4) break;
    uVar3 = (uint)(byte)buf[lVar4];
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void _tr_stored_block(s, buf, stored_len, eof)
    deflate_state *s;
    charf *buf;       /* input block */
    ulg stored_len;   /* length of input block */
    int eof;          /* true if this is the last block for a file */
{
    send_bits(s, (STORED_BLOCK<<1)+eof, 3);  /* send block type */
#ifdef DEBUG
    s->compressed_len = (s->compressed_len + 3 + 7) & (ulg)~7L;
    s->compressed_len += (stored_len + 4) << 3;
#endif
    copy_block(s, buf, (unsigned)stored_len, 1); /* with header */
}